

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O0

set<char,_std::greater<void>,_std::allocator<char>_> * __thiscall
burst::make_set<char,std::forward_list<char,std::allocator<char>>const&,std::greater<void>>
          (set<char,_std::greater<void>,_std::allocator<char>_> *__return_storage_ptr__,burst *this,
          forward_list<char,_std::allocator<char>_> *values,greater<void> *compare)

{
  greater<void> *__comp;
  allocator_type local_31;
  _Fwd_list_const_iterator<char> local_30;
  _Fwd_list_const_iterator<char> local_28;
  greater<void> *local_20;
  greater<void> *compare_local;
  forward_list<char,_std::allocator<char>_> *values_local;
  
  local_20 = (greater<void> *)values;
  compare_local = (greater<void> *)this;
  values_local = (forward_list<char,_std::allocator<char>_> *)__return_storage_ptr__;
  local_28._M_node =
       (_Fwd_list_node_base *)
       std::begin<std::forward_list<char,std::allocator<char>>>
                 ((forward_list<char,_std::allocator<char>_> *)this);
  local_30._M_node =
       (_Fwd_list_node_base *)
       std::end<std::forward_list<char,std::allocator<char>>>
                 ((forward_list<char,_std::allocator<char>_> *)compare_local);
  __comp = local_20;
  std::allocator<char>::allocator();
  std::set<char,std::greater<void>,std::allocator<char>>::set<std::_Fwd_list_const_iterator<char>>
            ((set<char,std::greater<void>,std::allocator<char>> *)__return_storage_ptr__,local_28,
             local_30,__comp,&local_31);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values, const Compare & compare)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value, Compare>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values)),
                compare
            );
    }